

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O0

void do_connect(uv_loop_t *loop,uv_tcp_t *tcp_client)

{
  int iVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_30 [4];
  int r;
  sockaddr_in addr;
  uv_tcp_t *tcp_client_local;
  uv_loop_t *loop_local;
  
  addr.sin_zero = (uchar  [8])tcp_client;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_30);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0xbe,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_init(loop,(uv_tcp_t *)addr.sin_zero);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0xc1,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_connect(&connect_req,(uv_tcp_t *)addr.sin_zero,(sockaddr *)local_30,connect_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,199,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void do_connect(uv_loop_t* loop, uv_tcp_t* tcp_client) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, tcp_client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     tcp_client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}